

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ParseUri(char *zDefaultVfs,char *zUri,uint *pFlags,sqlite3_vfs **ppVfs,char **pzFile,
                   char **pzErrMsg)

{
  char cVar1;
  uint uVar2;
  char *z_00;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  sqlite3_vfs *psVar10;
  bool bVar11;
  bool local_bc;
  char *z;
  int mode;
  int i;
  int limit;
  int mask;
  char *zModeType;
  OpenMode *aMode;
  int nVal;
  char *zVal;
  int nOpt;
  int octet;
  int nByte;
  int iOut;
  int iIn;
  int eState;
  char *zOpt;
  int nUri;
  char c;
  char *zFile;
  char *zVfs;
  uint flags;
  int rc;
  char **pzErrMsg_local;
  char **pzFile_local;
  sqlite3_vfs **ppVfs_local;
  uint *pFlags_local;
  char *zUri_local;
  char *zDefaultVfs_local;
  
  uVar2 = *pFlags;
  iVar6 = sqlite3Strlen30(zUri);
  zFile = zDefaultVfs;
  if (((((uVar2 & 0x40) == 0) && (sqlite3Config.bOpenUri == 0)) || (iVar6 < 5)) ||
     (iVar7 = memcmp(zUri,"file:",5), iVar7 != 0)) {
    _nUri = (char *)sqlite3_malloc(iVar6 + 2);
    if (_nUri == (char *)0x0) {
      return 7;
    }
    memcpy(_nUri,zUri,(long)iVar6);
    _nUri[iVar6] = '\0';
    _nUri[iVar6 + 1] = '\0';
    zVfs._0_4_ = uVar2 & 0xffffffbf;
  }
  else {
    octet = 0;
    nOpt = iVar6 + 2;
    zVfs._0_4_ = uVar2 | 0x40;
    for (nByte = 0; nByte < iVar6; nByte = nByte + 1) {
      nOpt = (uint)(zUri[nByte] == '&') + nOpt;
    }
    _nUri = (char *)sqlite3_malloc(nOpt);
    if (_nUri == (char *)0x0) {
      return 7;
    }
    if ((zUri[5] == '/') && (zUri[6] == '/')) {
      nByte = 7;
      while( true ) {
        bVar11 = false;
        if (zUri[nByte] != '\0') {
          bVar11 = zUri[nByte] != '/';
        }
        if (!bVar11) break;
        nByte = nByte + 1;
      }
      if ((nByte != 7) && ((nByte != 0x10 || (iVar6 = memcmp("localhost",zUri + 7,9), iVar6 != 0))))
      {
        pcVar9 = sqlite3_mprintf("invalid uri authority: %.*s",(ulong)(nByte - 7),zUri + 7);
        *pzErrMsg = pcVar9;
        zVfs._4_4_ = 1;
        goto LAB_001a4793;
      }
    }
    else {
      nByte = 5;
    }
    iOut = 0;
    while (zOpt._7_1_ = zUri[nByte], zOpt._7_1_ != '\0' && zOpt._7_1_ != '#') {
      iVar6 = nByte + 1;
      if (((zOpt._7_1_ == '%') && ((""[(byte)zUri[iVar6]] & 8) != 0)) &&
         ((""[(byte)zUri[nByte + 2]] & 8) != 0)) {
        iVar7 = nByte + 2;
        bVar4 = sqlite3HexToInt((int)zUri[iVar6]);
        nByte = nByte + 3;
        bVar5 = sqlite3HexToInt((int)zUri[iVar7]);
        iVar6 = (uint)bVar5 + (uint)bVar4 * 0x10;
        if (iVar6 == 0) {
          while( true ) {
            cVar1 = zUri[nByte];
            local_bc = false;
            if ((((cVar1 != '\0') && (local_bc = false, cVar1 != '#')) &&
                ((iOut != 0 || (local_bc = false, cVar1 != '?')))) &&
               ((iOut != 1 || ((local_bc = false, cVar1 != '=' && (local_bc = false, cVar1 != '&')))
                ))) {
              local_bc = iOut != 2 || cVar1 != '&';
            }
            if (!local_bc) break;
            nByte = nByte + 1;
          }
        }
        else {
          zOpt._7_1_ = (char)iVar6;
LAB_001a43a9:
          _nUri[octet] = zOpt._7_1_;
          octet = octet + 1;
        }
      }
      else {
        nByte = iVar6;
        if ((iOut != 1) || ((zOpt._7_1_ != '&' && (zOpt._7_1_ != '=')))) {
          if (((iOut == 0) && (zOpt._7_1_ == '?')) || ((iOut == 2 && (zOpt._7_1_ == '&')))) {
            zOpt._7_1_ = '\0';
            iOut = 1;
          }
          goto LAB_001a43a9;
        }
        if (_nUri[octet + -1] != '\0') {
          if (zOpt._7_1_ == '&') {
            _nUri[octet] = '\0';
            octet = octet + 1;
          }
          else {
            iOut = 2;
          }
          zOpt._7_1_ = '\0';
          goto LAB_001a43a9;
        }
        while( true ) {
          bVar11 = false;
          if ((zUri[nByte] != '\0') && (bVar11 = false, zUri[nByte] != '#')) {
            bVar11 = zUri[nByte + -1] != '&';
          }
          if (!bVar11) break;
          nByte = nByte + 1;
        }
      }
    }
    if (iOut == 1) {
      _nUri[octet] = '\0';
      octet = octet + 1;
    }
    _nUri[octet] = '\0';
    _nUri[octet + 1] = '\0';
    iVar6 = sqlite3Strlen30(_nUri);
    _iIn = (int *)(_nUri + (iVar6 + 1));
    while ((char)*_iIn != '\0') {
      iVar6 = sqlite3Strlen30((char *)_iIn);
      pcVar9 = (char *)((long)_iIn + (long)(iVar6 + 1));
      iVar7 = sqlite3Strlen30(pcVar9);
      if ((iVar6 != 3) || (iVar8 = memcmp("vfs",_iIn,3), pcVar3 = pcVar9, iVar8 != 0)) {
        zModeType = (char *)0x0;
        _limit = (char *)0x0;
        i = 0;
        mode = 0;
        if ((iVar6 == 5) && (iVar8 = memcmp("cache",_iIn,5), iVar8 == 0)) {
          i = 0x60000;
          zModeType = (char *)sqlite3ParseUri::aCacheMode;
          mode = 0x60000;
          _limit = "cache";
        }
        if ((iVar6 == 4) && (*_iIn == 0x65646f6d)) {
          i = 0x87;
          zModeType = (char *)sqlite3ParseUri::aOpenMode;
          mode = (uint)zVfs & 0x87;
          _limit = "access";
        }
        pcVar3 = zFile;
        if (zModeType != (char *)0x0) {
          z._0_4_ = 0;
          z._4_4_ = 0;
          while (*(long *)(zModeType + (long)z._4_4_ * 0x10) != 0) {
            z_00 = *(char **)(zModeType + (long)z._4_4_ * 0x10);
            iVar6 = sqlite3Strlen30(z_00);
            if ((iVar7 == iVar6) && (iVar6 = memcmp(pcVar9,z_00,(long)iVar7), iVar6 == 0)) {
              z._0_4_ = *(uint *)(zModeType + (long)z._4_4_ * 0x10 + 8);
              break;
            }
            z._4_4_ = z._4_4_ + 1;
          }
          if ((uint)z == 0) {
            pcVar9 = sqlite3_mprintf("no such %s mode: %s",_limit,pcVar9);
            *pzErrMsg = pcVar9;
            zVfs._4_4_ = 1;
            goto LAB_001a4793;
          }
          if (mode < (int)((uint)z & 0xffffff7f)) {
            pcVar9 = sqlite3_mprintf("%s mode not allowed: %s",_limit,pcVar9);
            *pzErrMsg = pcVar9;
            zVfs._4_4_ = 3;
            goto LAB_001a4793;
          }
          zVfs._0_4_ = (uint)zVfs & (i ^ 0xffffffffU) | (uint)z;
        }
      }
      zFile = pcVar3;
      _iIn = (int *)(pcVar9 + (iVar7 + 1));
    }
  }
  psVar10 = sqlite3_vfs_find(zFile);
  *ppVfs = psVar10;
  psVar10 = *ppVfs;
  if (psVar10 == (sqlite3_vfs *)0x0) {
    pcVar9 = sqlite3_mprintf("no such vfs: %s",zFile);
    *pzErrMsg = pcVar9;
  }
  zVfs._4_4_ = (uint)(psVar10 == (sqlite3_vfs *)0x0);
LAB_001a4793:
  if (zVfs._4_4_ != 0) {
    sqlite3_free(_nUri);
    _nUri = (char *)0x0;
  }
  *pFlags = (uint)zVfs;
  *pzFile = _nUri;
  return zVfs._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ParseUri(
  const char *zDefaultVfs,        /* VFS to use if no "vfs=xxx" query option */
  const char *zUri,               /* Nul-terminated URI to parse */
  unsigned int *pFlags,           /* IN/OUT: SQLITE_OPEN_XXX flags */
  sqlite3_vfs **ppVfs,            /* OUT: VFS to use */ 
  char **pzFile,                  /* OUT: Filename component of URI */
  char **pzErrMsg                 /* OUT: Error message (if rc!=SQLITE_OK) */
){
  int rc = SQLITE_OK;
  unsigned int flags = *pFlags;
  const char *zVfs = zDefaultVfs;
  char *zFile;
  char c;
  int nUri = sqlite3Strlen30(zUri);

  assert( *pzErrMsg==0 );

  if( ((flags & SQLITE_OPEN_URI) || sqlite3GlobalConfig.bOpenUri) 
   && nUri>=5 && memcmp(zUri, "file:", 5)==0 
  ){
    char *zOpt;
    int eState;                   /* Parser state when parsing URI */
    int iIn;                      /* Input character index */
    int iOut = 0;                 /* Output character index */
    int nByte = nUri+2;           /* Bytes of space to allocate */

    /* Make sure the SQLITE_OPEN_URI flag is set to indicate to the VFS xOpen 
    ** method that there may be extra parameters following the file-name.  */
    flags |= SQLITE_OPEN_URI;

    for(iIn=0; iIn<nUri; iIn++) nByte += (zUri[iIn]=='&');
    zFile = sqlite3_malloc(nByte);
    if( !zFile ) return SQLITE_NOMEM;

    /* Discard the scheme and authority segments of the URI. */
    if( zUri[5]=='/' && zUri[6]=='/' ){
      iIn = 7;
      while( zUri[iIn] && zUri[iIn]!='/' ) iIn++;

      if( iIn!=7 && (iIn!=16 || memcmp("localhost", &zUri[7], 9)) ){
        *pzErrMsg = sqlite3_mprintf("invalid uri authority: %.*s", 
            iIn-7, &zUri[7]);
        rc = SQLITE_ERROR;
        goto parse_uri_out;
      }
    }else{
      iIn = 5;
    }

    /* Copy the filename and any query parameters into the zFile buffer. 
    ** Decode %HH escape codes along the way. 
    **
    ** Within this loop, variable eState may be set to 0, 1 or 2, depending
    ** on the parsing context. As follows:
    **
    **   0: Parsing file-name.
    **   1: Parsing name section of a name=value query parameter.
    **   2: Parsing value section of a name=value query parameter.
    */
    eState = 0;
    while( (c = zUri[iIn])!=0 && c!='#' ){
      iIn++;
      if( c=='%' 
       && sqlite3Isxdigit(zUri[iIn]) 
       && sqlite3Isxdigit(zUri[iIn+1]) 
      ){
        int octet = (sqlite3HexToInt(zUri[iIn++]) << 4);
        octet += sqlite3HexToInt(zUri[iIn++]);

        assert( octet>=0 && octet<256 );
        if( octet==0 ){
          /* This branch is taken when "%00" appears within the URI. In this
          ** case we ignore all text in the remainder of the path, name or
          ** value currently being parsed. So ignore the current character
          ** and skip to the next "?", "=" or "&", as appropriate. */
          while( (c = zUri[iIn])!=0 && c!='#' 
              && (eState!=0 || c!='?')
              && (eState!=1 || (c!='=' && c!='&'))
              && (eState!=2 || c!='&')
          ){
            iIn++;
          }
          continue;
        }
        c = octet;
      }else if( eState==1 && (c=='&' || c=='=') ){
        if( zFile[iOut-1]==0 ){
          /* An empty option name. Ignore this option altogether. */
          while( zUri[iIn] && zUri[iIn]!='#' && zUri[iIn-1]!='&' ) iIn++;
          continue;
        }
        if( c=='&' ){
          zFile[iOut++] = '\0';
        }else{
          eState = 2;
        }
        c = 0;
      }else if( (eState==0 && c=='?') || (eState==2 && c=='&') ){
        c = 0;
        eState = 1;
      }
      zFile[iOut++] = c;
    }
    if( eState==1 ) zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';
    zFile[iOut++] = '\0';

    /* Check if there were any options specified that should be interpreted 
    ** here. Options that are interpreted here include "vfs" and those that
    ** correspond to flags that may be passed to the sqlite3_open_v2()
    ** method. */
    zOpt = &zFile[sqlite3Strlen30(zFile)+1];
    while( zOpt[0] ){
      int nOpt = sqlite3Strlen30(zOpt);
      char *zVal = &zOpt[nOpt+1];
      int nVal = sqlite3Strlen30(zVal);

      if( nOpt==3 && memcmp("vfs", zOpt, 3)==0 ){
        zVfs = zVal;
      }else{
        struct OpenMode {
          const char *z;
          int mode;
        } *aMode = 0;
        char *zModeType = 0;
        int mask = 0;
        int limit = 0;

        if( nOpt==5 && memcmp("cache", zOpt, 5)==0 ){
          static struct OpenMode aCacheMode[] = {
            { "shared",  SQLITE_OPEN_SHAREDCACHE },
            { "private", SQLITE_OPEN_PRIVATECACHE },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_SHAREDCACHE|SQLITE_OPEN_PRIVATECACHE;
          aMode = aCacheMode;
          limit = mask;
          zModeType = "cache";
        }
        if( nOpt==4 && memcmp("mode", zOpt, 4)==0 ){
          static struct OpenMode aOpenMode[] = {
            { "ro",  SQLITE_OPEN_READONLY },
            { "rw",  SQLITE_OPEN_READWRITE }, 
            { "rwc", SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE },
            { "memory", SQLITE_OPEN_MEMORY },
            { 0, 0 }
          };

          mask = SQLITE_OPEN_READONLY | SQLITE_OPEN_READWRITE
                   | SQLITE_OPEN_CREATE | SQLITE_OPEN_MEMORY;
          aMode = aOpenMode;
          limit = mask & flags;
          zModeType = "access";
        }

        if( aMode ){
          int i;
          int mode = 0;
          for(i=0; aMode[i].z; i++){
            const char *z = aMode[i].z;
            if( nVal==sqlite3Strlen30(z) && 0==memcmp(zVal, z, nVal) ){
              mode = aMode[i].mode;
              break;
            }
          }
          if( mode==0 ){
            *pzErrMsg = sqlite3_mprintf("no such %s mode: %s", zModeType, zVal);
            rc = SQLITE_ERROR;
            goto parse_uri_out;
          }
          if( (mode & ~SQLITE_OPEN_MEMORY)>limit ){
            *pzErrMsg = sqlite3_mprintf("%s mode not allowed: %s",
                                        zModeType, zVal);
            rc = SQLITE_PERM;
            goto parse_uri_out;
          }
          flags = (flags & ~mask) | mode;
        }
      }

      zOpt = &zVal[nVal+1];
    }

  }else{
    zFile = sqlite3_malloc(nUri+2);
    if( !zFile ) return SQLITE_NOMEM;
    memcpy(zFile, zUri, nUri);
    zFile[nUri] = '\0';
    zFile[nUri+1] = '\0';
    flags &= ~SQLITE_OPEN_URI;
  }

  *ppVfs = sqlite3_vfs_find(zVfs);
  if( *ppVfs==0 ){
    *pzErrMsg = sqlite3_mprintf("no such vfs: %s", zVfs);
    rc = SQLITE_ERROR;
  }
 parse_uri_out:
  if( rc!=SQLITE_OK ){
    sqlite3_free(zFile);
    zFile = 0;
  }
  *pFlags = flags;
  *pzFile = zFile;
  return rc;
}